

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  U *pUVar1;
  undefined1 *puVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  size_t __n;
  undefined1 *__src;
  iterator NewEnd;
  void *pvVar6;
  long lVar7;
  ulong __n_00;
  
  if (this == RHS) {
    return this;
  }
  __src = (undefined1 *)
          (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>
          .super_SmallVectorBase.BeginX;
  pUVar1 = &(RHS->super_SmallVectorTemplateBase<int,_true>).
            super_SmallVectorTemplateCommon<int,_void>.FirstEl;
  if ((U *)__src != pUVar1) {
    puVar2 = (undefined1 *)
             (this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    if ((U *)puVar2 !=
        &(this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>
         .FirstEl) {
      free(puVar2);
      __src = (undefined1 *)
              (RHS->super_SmallVectorTemplateBase<int,_true>).
              super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    }
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.BeginX = __src;
    pvVar6 = (RHS->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX;
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX =
         (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
         super_SmallVectorBase.EndX;
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.CapacityX = pvVar6;
    (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.CapacityX = pUVar1;
    (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = pUVar1;
    (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.BeginX = pUVar1;
    return this;
  }
  puVar2 = (undefined1 *)
           (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  __n_00 = (long)puVar2 - (long)__src;
  pvVar6 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar4 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  __n = (long)pvVar4 - (long)pvVar6;
  if (__n_00 <= __n) {
    if (puVar2 != __src) {
      memmove(pvVar6,__src,__n_00);
      pvVar6 = (void *)((long)pvVar6 + __n_00);
      __src = (undefined1 *)
              (RHS->super_SmallVectorTemplateBase<int,_true>).
              super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    }
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = pvVar6;
    (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = __src;
    return this;
  }
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                    super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX -
             (long)pvVar6) < __n_00) {
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = pvVar6;
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,
               &(this->super_SmallVectorTemplateBase<int,_true>).
                super_SmallVectorTemplateCommon<int,_void>.FirstEl,__n_00,4);
  }
  else if (pvVar4 != pvVar6) {
    lVar7 = (long)__n >> 2;
    memmove(pvVar6,__src,__n);
    goto LAB_00109681;
  }
  lVar7 = 0;
LAB_00109681:
  pvVar4 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar3 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  pvVar6 = (void *)((long)pvVar4 + lVar7 * 4);
  pvVar5 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  if (pvVar6 != pvVar3) {
    memcpy((void *)((long)pvVar5 + lVar7 * 4),pvVar6,(long)pvVar3 - (long)pvVar6);
    pvVar5 = (this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    pvVar4 = (RHS->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  }
  (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.EndX = (void *)((long)pvVar5 + __n_00);
  (RHS->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.EndX = pvVar4;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) std::free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}